

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void chatra::initializeStTables(void)

{
  initializer_list<chatra::StatementPatternElement> __l;
  initializer_list<chatra::StatementPatternElement> __l_00;
  initializer_list<chatra::StatementPatternElement> __l_01;
  initializer_list<chatra::StatementPatternElement> __l_02;
  initializer_list<chatra::StatementPatternElement> __l_03;
  initializer_list<chatra::StatementPatternElement> __l_04;
  initializer_list<chatra::StatementPatternElement> __l_05;
  initializer_list<chatra::StatementPatternElement> __l_06;
  initializer_list<chatra::StatementPatternElement> __l_07;
  initializer_list<chatra::StatementPatternElement> __l_08;
  initializer_list<chatra::StatementPatternElement> __l_09;
  initializer_list<chatra::StatementPatternElement> __l_10;
  initializer_list<chatra::StatementPatternElement> __l_11;
  initializer_list<chatra::StatementPatternElement> __l_12;
  initializer_list<chatra::StatementPatternElement> __l_13;
  initializer_list<chatra::StatementPatternElement> __l_14;
  initializer_list<chatra::StatementPatternElement> __l_15;
  initializer_list<chatra::StatementPatternElement> __l_16;
  initializer_list<std::pair<chatra::NodeType,_chatra::StatementAttributes>_> __l_17;
  bool bVar1;
  unsigned_long *puVar2;
  reference ppVar3;
  reference this;
  StatementPatternElement *local_21f0;
  StatementPatternElement *local_21d8;
  StatementPatternElement *local_21c0;
  StatementPatternElement *local_21a8;
  StatementPatternElement *local_2190;
  StatementPatternElement *local_2178;
  StatementPatternElement *local_2160;
  StatementPatternElement *local_2148;
  StatementPatternElement *local_2130;
  StatementPatternElement *local_2118;
  StatementPatternElement *local_2100;
  StatementPatternElement *local_20e8;
  StatementPatternElement *local_20d0;
  StatementPatternElement *local_20b8;
  StatementPatternElement *local_20a0;
  StatementPatternElement *local_2088;
  StatementPatternElement *local_2070;
  StatementPatternElement *local_2058;
  pair<chatra::NodeType,_chatra::StatementAttributes> *local_2040;
  pair<chatra::NodeType,_chatra::StatementAttributes> *p_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
  *__range1_1;
  reference local_1b98;
  pair<chatra::NodeType,_chatra::StatementAttributes> *p;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
  *__range1;
  size_t maxIndex;
  string local_1b68;
  StatementPatternElement *local_1b48;
  StatementPatternElement local_1b40;
  StatementPatternElement *local_1b08;
  size_type local_1b00;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1af8;
  StatementAttributes local_1ae0;
  NodeType local_1ab4;
  allocator<chatra::StatementPatternElement> local_1ab3;
  undefined1 local_1ab2;
  allocator local_1ab1;
  string local_1ab0;
  StatementPatternElement *local_1a90;
  StatementPatternElement local_1a88;
  StatementPatternElement *local_1a50;
  size_type local_1a48;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1a40;
  StatementAttributes local_1a28;
  NodeType local_19fc;
  allocator<chatra::StatementPatternElement> local_19fb;
  undefined1 local_19fa;
  allocator local_19f9;
  string local_19f8;
  StatementPatternElement *local_19d8;
  StatementPatternElement local_19d0;
  StatementPatternElement *local_1998;
  size_type local_1990;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1988;
  StatementAttributes local_1970;
  NodeType local_1944;
  allocator<chatra::StatementPatternElement> local_1943;
  undefined1 local_1942;
  allocator local_1941;
  string local_1940;
  StatementPatternElement *local_1920;
  StatementPatternElement local_1918;
  StatementPatternElement *local_18e0;
  size_type local_18d8;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_18d0;
  StatementAttributes local_18b8;
  NodeType local_1889;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1888;
  StatementAttributes local_1870;
  NodeType local_1844;
  allocator<chatra::StatementPatternElement> local_1843;
  undefined1 local_1842;
  allocator local_1841;
  string local_1840;
  allocator local_1819;
  string local_1818;
  StatementPatternElement *local_17f8;
  StatementPatternElement local_17f0;
  StatementPatternElement local_17b8;
  iterator local_1780;
  size_type local_1778;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1770;
  StatementAttributes local_1758;
  NodeType local_1729;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1728;
  StatementAttributes local_1708;
  NodeType local_16d9;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_16d8;
  StatementAttributes local_16b8;
  NodeType local_168c;
  allocator<chatra::StatementPatternElement> local_168b;
  undefined1 local_168a;
  allocator local_1689;
  string local_1688;
  StatementPatternElement *local_1668;
  StatementPatternElement local_1660;
  StatementPatternElement *local_1628;
  size_type local_1620;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1618;
  StatementAttributes local_1600;
  NodeType local_15d4;
  allocator<chatra::StatementPatternElement> local_15d3;
  undefined1 local_15d2;
  allocator local_15d1;
  string local_15d0;
  StatementPatternElement *local_15b0;
  StatementPatternElement local_15a8;
  StatementPatternElement *local_1570;
  size_type local_1568;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1560;
  StatementAttributes local_1548;
  NodeType local_151c;
  allocator<chatra::StatementPatternElement> local_151b;
  undefined1 local_151a;
  allocator local_1519;
  string local_1518;
  allocator local_14f1;
  string local_14f0;
  allocator local_14c9;
  string local_14c8;
  StatementPatternElement *local_14a8;
  StatementPatternElement local_14a0;
  StatementPatternElement local_1468;
  StatementPatternElement local_1430;
  iterator local_13f8;
  size_type local_13f0;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_13e8;
  StatementAttributes local_13d0;
  NodeType local_13a4;
  allocator<chatra::StatementPatternElement> local_13a3;
  undefined1 local_13a2;
  allocator local_13a1;
  string local_13a0;
  allocator local_1379;
  string local_1378;
  allocator local_1351;
  string local_1350;
  allocator local_1329;
  string local_1328;
  allocator local_1301;
  string local_1300;
  allocator local_12d9;
  string local_12d8;
  StatementPatternElement *local_12b8;
  StatementPatternElement local_12b0;
  StatementPatternElement local_1278;
  StatementPatternElement local_1240;
  StatementPatternElement local_1208;
  StatementPatternElement local_11d0;
  StatementPatternElement local_1198;
  iterator local_1160;
  size_type local_1158;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1150;
  StatementAttributes local_1138;
  NodeType local_1109;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1108;
  StatementAttributes local_10e8;
  NodeType local_10bc;
  allocator<chatra::StatementPatternElement> local_10bb;
  undefined1 local_10ba;
  allocator local_10b9;
  string local_10b8;
  StatementPatternElement *local_1098;
  StatementPatternElement local_1090;
  StatementPatternElement *local_1058;
  size_type local_1050;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_1048;
  StatementAttributes local_1030;
  NodeType local_1004;
  allocator<chatra::StatementPatternElement> local_1003;
  undefined1 local_1002;
  allocator local_1001;
  string local_1000;
  StatementPatternElement *local_fe0;
  StatementPatternElement local_fd8;
  StatementPatternElement *local_fa0;
  size_type local_f98;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_f90;
  StatementAttributes local_f78;
  NodeType local_f49;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_f48;
  StatementAttributes local_f28;
  NodeType local_efc;
  allocator<chatra::StatementPatternElement> local_efb;
  undefined1 local_efa;
  allocator local_ef9;
  string local_ef8;
  allocator local_ed1;
  string local_ed0;
  allocator local_ea9;
  string local_ea8;
  StatementPatternElement *local_e88;
  StatementPatternElement local_e80;
  StatementPatternElement local_e48;
  StatementPatternElement local_e10;
  iterator local_dd8;
  size_type local_dd0;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_dc8;
  StatementAttributes local_db0;
  NodeType local_d84;
  allocator<chatra::StatementPatternElement> local_d83;
  undefined1 local_d82;
  allocator local_d81;
  string local_d80;
  StatementPatternElement *local_d60;
  StatementPatternElement local_d58;
  StatementPatternElement *local_d20;
  size_type local_d18;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_d10;
  StatementAttributes local_cf8;
  NodeType local_cc9;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_cc8;
  StatementAttributes local_cb0;
  NodeType local_c84;
  allocator<chatra::StatementPatternElement> local_c83;
  undefined1 local_c82;
  allocator local_c81;
  string local_c80;
  StatementPatternElement *local_c60;
  StatementPatternElement local_c58;
  StatementPatternElement *local_c20;
  size_type local_c18;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_c10;
  StatementAttributes local_bf8;
  NodeType local_bcc;
  allocator<chatra::StatementPatternElement> local_bcb;
  undefined1 local_bca;
  allocator local_bc9;
  string local_bc8;
  allocator local_ba1;
  string local_ba0;
  allocator local_b79;
  string local_b78;
  allocator local_b51;
  string local_b50;
  StatementPatternElement *local_b30;
  StatementPatternElement local_b28;
  StatementPatternElement local_af0;
  StatementPatternElement local_ab8;
  StatementPatternElement local_a80;
  iterator local_a48;
  size_type local_a40;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_a38;
  StatementAttributes local_a20;
  NodeType local_9f4;
  allocator<chatra::StatementPatternElement> local_9f3;
  undefined1 local_9f2;
  allocator local_9f1;
  string local_9f0;
  StatementPatternElement *local_9d0;
  StatementPatternElement local_9c8;
  StatementPatternElement *local_990;
  size_type local_988;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_980;
  StatementAttributes local_968;
  NodeType local_93c;
  allocator<chatra::StatementPatternElement> local_93b;
  undefined1 local_93a;
  allocator local_939;
  string local_938;
  allocator local_911;
  string local_910;
  allocator local_8e9;
  string local_8e8;
  allocator local_8c1;
  string local_8c0;
  allocator local_899;
  string local_898;
  allocator local_871;
  string local_870;
  allocator local_849;
  string local_848;
  allocator local_821;
  string local_820;
  StatementPatternElement *local_800;
  StatementPatternElement local_7f8;
  StatementPatternElement local_7c0;
  StatementPatternElement local_788;
  StatementPatternElement local_750;
  StatementPatternElement local_718;
  StatementPatternElement local_6e0;
  StatementPatternElement local_6a8;
  StatementPatternElement local_670;
  iterator local_638;
  size_type local_630;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_628;
  StatementAttributes local_610;
  NodeType local_5e4;
  allocator<chatra::StatementPatternElement> local_5e3;
  undefined1 local_5e2;
  allocator local_5e1;
  string local_5e0;
  allocator local_5a9;
  string local_5a8;
  StatementPatternElement *local_588;
  StatementPatternElement local_580;
  StatementPatternElement local_548;
  iterator local_510;
  size_type local_508;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  local_500;
  StatementAttributes local_4e8;
  NodeType local_4b9;
  pair<chatra::NodeType,_chatra::StatementAttributes> *local_4b8;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_4b0;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_480;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_450;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_420;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_3f0;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_3c0;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_390;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_360;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_330;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_300;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_2d0;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_2a0;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_270;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_240;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_210;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_1e0;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_1b0;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_180;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_150;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_120;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_f0;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_c0;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_90;
  pair<chatra::NodeType,_chatra::StatementAttributes> local_60;
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
  sourceForStAttrs;
  
  maxIndex._4_1_ = 1;
  local_4b8 = &local_4b0;
  local_4b9 = Import;
  local_5e2 = 1;
  local_588 = &local_580;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5a8,"",&local_5a9);
  StatementPatternElement::StatementPatternElement
            (&local_580,LabelWithColon,Invalid,false,0,&local_5a8);
  local_588 = &local_548;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5e0,"expected package name",&local_5e1);
  StatementPatternElement::StatementPatternElement(&local_548,Name,Invalid,true,1,&local_5e0);
  local_5e2 = 0;
  local_510 = &local_580;
  local_508 = 2;
  std::allocator<chatra::StatementPatternElement>::allocator(&local_5e3);
  __l_16._M_len = local_508;
  __l_16._M_array = local_510;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_500,__l_16,&local_5e3);
  StatementAttributes::StatementAttributes(&local_4e8,2,1,&local_500);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_4b0,&local_4b9,&local_4e8);
  local_5e4 = Def;
  local_93a = 1;
  local_800 = &local_7f8;
  local_4b8 = &local_480;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_820,"",&local_821);
  StatementPatternElement::StatementPatternElement
            (&local_7f8,StorageClassSpecifier,Invalid,false,0,&local_820);
  local_800 = &local_7c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_848,"",&local_849);
  StatementPatternElement::StatementPatternElement(&local_7c0,Name,Invalid,false,1,&local_848);
  local_800 = &local_788;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_870,"",&local_871);
  StatementPatternElement::StatementPatternElement
            (&local_788,VariationName,Invalid,false,2,&local_870);
  local_800 = &local_750;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_898,"expected parameter list",&local_899);
  StatementPatternElement::StatementPatternElement
            (&local_750,ParameterList,Invalid,true,3,&local_898);
  local_800 = &local_718;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8c0,"",&local_8c1);
  StatementPatternElement::StatementPatternElement
            (&local_718,VariationName,Invalid,false,4,&local_8c0);
  local_800 = &local_6e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8e8,"",&local_8e9);
  StatementPatternElement::StatementPatternElement
            (&local_6e0,ParameterList,Invalid,false,5,&local_8e8);
  local_800 = &local_6a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_910,"",&local_911);
  StatementPatternElement::StatementPatternElement(&local_6a8,Token,Delete,false,6,&local_910);
  local_800 = &local_670;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_938,"",&local_939);
  StatementPatternElement::StatementPatternElement(&local_670,Qualifiers,Invalid,false,7,&local_938)
  ;
  local_93a = 0;
  local_638 = &local_7f8;
  local_630 = 8;
  std::allocator<chatra::StatementPatternElement>::allocator(&local_93b);
  __l_15._M_len = local_630;
  __l_15._M_array = local_638;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_628,__l_15,&local_93b);
  StatementAttributes::StatementAttributes(&local_610,8,1,&local_628);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_480,&local_5e4,&local_610);
  local_93c = DefOperator;
  local_9f2 = 1;
  local_9d0 = &local_9c8;
  local_4b8 = &local_450;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9f0,"expected operator parameter set",&local_9f1);
  StatementPatternElement::StatementPatternElement
            (&local_9c8,OperatorParameter,Invalid,true,0,&local_9f0);
  local_9f2 = 0;
  local_988 = 1;
  local_990 = &local_9c8;
  std::allocator<chatra::StatementPatternElement>::allocator(&local_9f3);
  __l_14._M_len = local_988;
  __l_14._M_array = local_990;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_980,__l_14,&local_9f3);
  StatementAttributes::StatementAttributes(&local_968,1,2,&local_980);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_450,&local_93c,&local_968);
  local_9f4 = Class;
  local_bca = 1;
  local_b30 = &local_b28;
  local_4b8 = &local_420;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b50,"",&local_b51);
  StatementPatternElement::StatementPatternElement
            (&local_b28,StorageClassSpecifier,Invalid,false,0,&local_b50);
  local_b30 = &local_af0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b78,"expected class name",&local_b79);
  StatementPatternElement::StatementPatternElement(&local_af0,Name,Invalid,true,1,&local_b78);
  local_b30 = &local_ab8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ba0,"",&local_ba1);
  StatementPatternElement::StatementPatternElement(&local_ab8,Token,Extends,false,2,&local_ba0);
  local_b30 = &local_a80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_bc8,"",&local_bc9);
  StatementPatternElement::StatementPatternElement(&local_a80,ClassList,Invalid,false,3,&local_bc8);
  local_bca = 0;
  local_a48 = &local_b28;
  local_a40 = 4;
  std::allocator<chatra::StatementPatternElement>::allocator(&local_bcb);
  __l_13._M_len = local_a40;
  __l_13._M_array = local_a48;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_a38,__l_13,&local_bcb);
  StatementAttributes::StatementAttributes(&local_a20,4,1,&local_a38);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_420,&local_9f4,&local_a20);
  local_bcc = Expression;
  local_c82 = 1;
  local_c60 = &local_c58;
  local_4b8 = &local_3f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c80,"expected expression",&local_c81);
  StatementPatternElement::StatementPatternElement(&local_c58,Expression,Invalid,true,0,&local_c80);
  local_c82 = 0;
  local_c18 = 1;
  local_c20 = &local_c58;
  std::allocator<chatra::StatementPatternElement>::allocator(&local_c83);
  __l_12._M_len = local_c18;
  __l_12._M_array = local_c20;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_c10,__l_12,&local_c83);
  StatementAttributes::StatementAttributes(&local_bf8,1,0,&local_c10);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_3f0,&local_bcc,&local_bf8);
  local_c84 = Sync;
  local_cc8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_cc8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_cc8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4b8 = &local_3c0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_cc8);
  StatementAttributes::StatementAttributes(&local_cb0,0,1,&local_cc8);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_3c0,&local_c84,&local_cb0);
  local_cc9 = Touch;
  local_d82 = 1;
  local_d60 = &local_d58;
  local_4b8 = &local_390;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d80,"expected expression",&local_d81);
  StatementPatternElement::StatementPatternElement(&local_d58,Expression,Invalid,true,0,&local_d80);
  local_d82 = 0;
  local_d18 = 1;
  local_d20 = &local_d58;
  std::allocator<chatra::StatementPatternElement>::allocator(&local_d83);
  __l_11._M_len = local_d18;
  __l_11._M_array = local_d20;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_d10,__l_11,&local_d83);
  StatementAttributes::StatementAttributes(&local_cf8,1,1,&local_d10);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_390,&local_cc9,&local_cf8);
  local_d84 = Var;
  local_efa = 1;
  local_e88 = &local_e80;
  local_4b8 = &local_360;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ea8,"",&local_ea9);
  StatementPatternElement::StatementPatternElement
            (&local_e80,StorageClassSpecifier,Invalid,false,0,&local_ea8);
  local_e88 = &local_e48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ed0,"expected variable definitions",&local_ed1);
  StatementPatternElement::StatementPatternElement
            (&local_e48,VarDefinitions,Invalid,true,1,&local_ed0);
  local_e88 = &local_e10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ef8,"",&local_ef9);
  StatementPatternElement::StatementPatternElement(&local_e10,Qualifiers,Invalid,false,2,&local_ef8)
  ;
  local_efa = 0;
  local_dd8 = &local_e80;
  local_dd0 = 3;
  std::allocator<chatra::StatementPatternElement>::allocator(&local_efb);
  __l_10._M_len = local_dd0;
  __l_10._M_array = local_dd8;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_dc8,__l_10,&local_efb);
  StatementAttributes::StatementAttributes(&local_db0,3,1,&local_dc8);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_360,&local_d84,&local_db0);
  local_efc = IfGroup;
  local_f48.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f48.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f48.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4b8 = &local_330;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_f48);
  StatementAttributes::StatementAttributes(&local_f28,0,0,&local_f48);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_330,&local_efc,&local_f28);
  local_f49 = If;
  local_1002 = 1;
  local_fe0 = &local_fd8;
  local_4b8 = &local_300;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1000,"expected expression",&local_1001);
  StatementPatternElement::StatementPatternElement(&local_fd8,Expression,Invalid,true,0,&local_1000)
  ;
  local_1002 = 0;
  local_f98 = 1;
  local_fa0 = &local_fd8;
  std::allocator<chatra::StatementPatternElement>::allocator(&local_1003);
  __l_09._M_len = local_f98;
  __l_09._M_array = local_fa0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_f90,__l_09,&local_1003);
  StatementAttributes::StatementAttributes(&local_f78,1,1,&local_f90);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_300,&local_f49,&local_f78);
  local_1004 = ElseIf;
  local_10ba = 1;
  local_1098 = &local_1090;
  local_4b8 = &local_2d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_10b8,"expected expression",&local_10b9);
  StatementPatternElement::StatementPatternElement
            (&local_1090,Expression,Invalid,true,0,&local_10b8);
  local_10ba = 0;
  local_1050 = 1;
  local_1058 = &local_1090;
  std::allocator<chatra::StatementPatternElement>::allocator(&local_10bb);
  __l_08._M_len = local_1050;
  __l_08._M_array = local_1058;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1048,__l_08,&local_10bb);
  StatementAttributes::StatementAttributes(&local_1030,1,2,&local_1048);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_2d0,&local_1004,&local_1030);
  local_10bc = Else;
  local_1108.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1108.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1108.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4b8 = &local_2a0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1108);
  StatementAttributes::StatementAttributes(&local_10e8,0,1,&local_1108);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_2a0,&local_10bc,&local_10e8);
  local_1109 = For;
  local_13a2 = 1;
  local_12b8 = &local_12b0;
  local_4b8 = &local_270;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_12d8,"",&local_12d9);
  StatementPatternElement::StatementPatternElement
            (&local_12b0,LabelWithColon,Invalid,false,1,&local_12d8);
  local_12b8 = &local_1278;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1300,"",&local_1301);
  StatementPatternElement::StatementPatternElement
            (&local_1278,Token,For,true,0xffffffffffffffff,&local_1300);
  local_12b8 = &local_1240;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1328,"",&local_1329);
  StatementPatternElement::StatementPatternElement
            (&local_1240,LabelWithColon,Invalid,false,2,&local_1328);
  local_12b8 = &local_1208;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1350,"",&local_1351);
  StatementPatternElement::StatementPatternElement
            (&local_1208,ForLoopVariables,Invalid,false,0,&local_1350);
  local_12b8 = &local_11d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1378,"expected \"in\"",&local_1379);
  StatementPatternElement::StatementPatternElement
            (&local_11d0,Token,In,true,0xffffffffffffffff,&local_1378);
  local_12b8 = &local_1198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_13a0,"expected expression",&local_13a1);
  StatementPatternElement::StatementPatternElement
            (&local_1198,Expression,Invalid,true,3,&local_13a0);
  local_13a2 = 0;
  local_1160 = &local_12b0;
  local_1158 = 6;
  std::allocator<chatra::StatementPatternElement>::allocator(&local_13a3);
  __l_07._M_len = local_1158;
  __l_07._M_array = local_1160;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1150,__l_07,&local_13a3);
  StatementAttributes::StatementAttributes(&local_1138,4,0,&local_1150);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_270,&local_1109,&local_1138);
  local_13a4 = While;
  local_151a = 1;
  local_14a8 = &local_14a0;
  local_4b8 = &local_240;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_14c8,"",&local_14c9);
  StatementPatternElement::StatementPatternElement
            (&local_14a0,LabelWithColon,Invalid,false,0,&local_14c8);
  local_14a8 = &local_1468;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_14f0,"",&local_14f1);
  StatementPatternElement::StatementPatternElement
            (&local_1468,Token,While,true,0xffffffffffffffff,&local_14f0);
  local_14a8 = &local_1430;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1518,"expected expression",&local_1519);
  StatementPatternElement::StatementPatternElement
            (&local_1430,Expression,Invalid,true,1,&local_1518);
  local_151a = 0;
  local_13f8 = &local_14a0;
  local_13f0 = 3;
  std::allocator<chatra::StatementPatternElement>::allocator(&local_151b);
  __l_06._M_len = local_13f0;
  __l_06._M_array = local_13f8;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_13e8,__l_06,&local_151b);
  StatementAttributes::StatementAttributes(&local_13d0,2,0,&local_13e8);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_240,&local_13a4,&local_13d0);
  local_151c = Switch;
  local_15d2 = 1;
  local_15b0 = &local_15a8;
  local_4b8 = &local_210;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_15d0,"expected expression",&local_15d1);
  StatementPatternElement::StatementPatternElement
            (&local_15a8,Expression,Invalid,true,0,&local_15d0);
  local_15d2 = 0;
  local_1568 = 1;
  local_1570 = &local_15a8;
  std::allocator<chatra::StatementPatternElement>::allocator(&local_15d3);
  __l_05._M_len = local_1568;
  __l_05._M_array = local_1570;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1560,__l_05,&local_15d3);
  StatementAttributes::StatementAttributes(&local_1548,1,1,&local_1560);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_210,&local_151c,&local_1548);
  local_15d4 = Case;
  local_168a = 1;
  local_1668 = &local_1660;
  local_4b8 = &local_1e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1688,"expected expression",&local_1689);
  StatementPatternElement::StatementPatternElement
            (&local_1660,Expression,Invalid,true,0,&local_1688);
  local_168a = 0;
  local_1620 = 1;
  local_1628 = &local_1660;
  std::allocator<chatra::StatementPatternElement>::allocator(&local_168b);
  __l_04._M_len = local_1620;
  __l_04._M_array = local_1628;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1618,__l_04,&local_168b);
  StatementAttributes::StatementAttributes(&local_1600,1,1,&local_1618);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_1e0,&local_15d4,&local_1600);
  local_168c = Default;
  local_16d8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_16d8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16d8.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4b8 = &local_1b0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_16d8);
  StatementAttributes::StatementAttributes(&local_16b8,0,1,&local_16d8);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_1b0,&local_168c,&local_16b8);
  local_16d9 = Do;
  local_1728.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1728.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1728.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4b8 = &local_180;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1728);
  StatementAttributes::StatementAttributes(&local_1708,0,1,&local_1728);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_180,&local_16d9,&local_1708);
  local_1729 = Catch;
  local_1842 = 1;
  local_17f8 = &local_17f0;
  local_4b8 = &local_150;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1818,"",&local_1819);
  StatementPatternElement::StatementPatternElement
            (&local_17f0,LabelWithColon,Invalid,false,0,&local_1818);
  local_17f8 = &local_17b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1840,"expected exception-class list",&local_1841);
  StatementPatternElement::StatementPatternElement(&local_17b8,ClassList,Invalid,true,1,&local_1840)
  ;
  local_1842 = 0;
  local_1780 = &local_17f0;
  local_1778 = 2;
  std::allocator<chatra::StatementPatternElement>::allocator(&local_1843);
  __l_03._M_len = local_1778;
  __l_03._M_array = local_1780;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1770,__l_03,&local_1843);
  StatementAttributes::StatementAttributes(&local_1758,2,1,&local_1770);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_150,&local_1729,&local_1758);
  local_1844 = Finally;
  local_1888.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1888.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1888.
  super__Vector_base<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4b8 = &local_120;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1888);
  StatementAttributes::StatementAttributes(&local_1870,0,1,&local_1888);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_120,&local_1844,&local_1870);
  local_1889 = Break;
  local_1942 = 1;
  local_1920 = &local_1918;
  local_4b8 = &local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1940,"",&local_1941);
  StatementPatternElement::StatementPatternElement(&local_1918,Label,Invalid,false,0,&local_1940);
  local_1942 = 0;
  local_18d8 = 1;
  local_18e0 = &local_1918;
  std::allocator<chatra::StatementPatternElement>::allocator(&local_1943);
  __l_02._M_len = local_18d8;
  __l_02._M_array = local_18e0;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_18d0,__l_02,&local_1943);
  StatementAttributes::StatementAttributes(&local_18b8,1,1,&local_18d0);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_f0,&local_1889,&local_18b8);
  local_1944 = Continue;
  local_19fa = 1;
  local_19d8 = &local_19d0;
  local_4b8 = &local_c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_19f8,"",&local_19f9);
  StatementPatternElement::StatementPatternElement(&local_19d0,Label,Invalid,false,0,&local_19f8);
  local_19fa = 0;
  local_1990 = 1;
  local_1998 = &local_19d0;
  std::allocator<chatra::StatementPatternElement>::allocator(&local_19fb);
  __l_01._M_len = local_1990;
  __l_01._M_array = local_1998;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1988,__l_01,&local_19fb);
  StatementAttributes::StatementAttributes(&local_1970,1,1,&local_1988);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_c0,&local_1944,&local_1970);
  local_19fc = Return;
  local_1ab2 = 1;
  local_1a90 = &local_1a88;
  local_4b8 = &local_90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1ab0,"",&local_1ab1);
  StatementPatternElement::StatementPatternElement
            (&local_1a88,TupleExpression,Invalid,false,0,&local_1ab0);
  local_1ab2 = 0;
  local_1a48 = 1;
  local_1a50 = &local_1a88;
  std::allocator<chatra::StatementPatternElement>::allocator(&local_1ab3);
  __l_00._M_len = local_1a48;
  __l_00._M_array = local_1a50;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1a40,__l_00,&local_1ab3);
  StatementAttributes::StatementAttributes(&local_1a28,1,1,&local_1a40);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_90,&local_19fc,&local_1a28);
  local_1ab4 = Throw;
  maxIndex._6_1_ = 1;
  local_1b48 = &local_1b40;
  local_4b8 = &local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b68,"",(allocator *)((long)&maxIndex + 7));
  StatementPatternElement::StatementPatternElement
            (&local_1b40,Expression,Invalid,false,0,&local_1b68);
  maxIndex._6_1_ = 0;
  local_1b00 = 1;
  local_1b08 = &local_1b40;
  std::allocator<chatra::StatementPatternElement>::allocator
            ((allocator<chatra::StatementPatternElement> *)((long)&maxIndex + 5));
  __l._M_len = local_1b00;
  __l._M_array = local_1b08;
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  vector(&local_1af8,__l,(allocator<chatra::StatementPatternElement> *)((long)&maxIndex + 5));
  StatementAttributes::StatementAttributes(&local_1ae0,1,1,&local_1af8);
  std::pair<chatra::NodeType,_chatra::StatementAttributes>::pair<chatra::NodeType,_true>
            (&local_60,&local_1ab4,&local_1ae0);
  maxIndex._4_1_ = 0;
  local_30 = &local_4b0;
  local_28 = 0x18;
  std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>::allocator
            ((allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_> *)
             ((long)&maxIndex + 3));
  __l_17._M_len = local_28;
  __l_17._M_array = local_30;
  std::
  vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
  ::vector((vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
            *)local_20,__l_17,
           (allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_> *)
           ((long)&maxIndex + 3));
  std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>::~allocator
            ((allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_> *)
             ((long)&maxIndex + 3));
  local_2040 = (pair<chatra::NodeType,_chatra::StatementAttributes> *)&local_30;
  do {
    local_2040 = local_2040 + -1;
    std::pair<chatra::NodeType,_chatra::StatementAttributes>::~pair(local_2040);
  } while (local_2040 != &local_4b0);
  StatementAttributes::~StatementAttributes(&local_1ae0);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1af8);
  std::allocator<chatra::StatementPatternElement>::~allocator
            ((allocator<chatra::StatementPatternElement> *)((long)&maxIndex + 5));
  local_2058 = (StatementPatternElement *)&local_1b08;
  do {
    local_2058 = local_2058 + -1;
    StatementPatternElement::~StatementPatternElement(local_2058);
  } while (local_2058 != &local_1b40);
  std::__cxx11::string::~string((string *)&local_1b68);
  std::allocator<char>::~allocator((allocator<char> *)((long)&maxIndex + 7));
  StatementAttributes::~StatementAttributes(&local_1a28);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1a40);
  std::allocator<chatra::StatementPatternElement>::~allocator(&local_1ab3);
  local_2070 = (StatementPatternElement *)&local_1a50;
  do {
    local_2070 = local_2070 + -1;
    StatementPatternElement::~StatementPatternElement(local_2070);
  } while (local_2070 != &local_1a88);
  std::__cxx11::string::~string((string *)&local_1ab0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ab1);
  StatementAttributes::~StatementAttributes(&local_1970);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1988);
  std::allocator<chatra::StatementPatternElement>::~allocator(&local_19fb);
  local_2088 = (StatementPatternElement *)&local_1998;
  do {
    local_2088 = local_2088 + -1;
    StatementPatternElement::~StatementPatternElement(local_2088);
  } while (local_2088 != &local_19d0);
  std::__cxx11::string::~string((string *)&local_19f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_19f9);
  StatementAttributes::~StatementAttributes(&local_18b8);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_18d0);
  std::allocator<chatra::StatementPatternElement>::~allocator(&local_1943);
  local_20a0 = (StatementPatternElement *)&local_18e0;
  do {
    local_20a0 = local_20a0 + -1;
    StatementPatternElement::~StatementPatternElement(local_20a0);
  } while (local_20a0 != &local_1918);
  std::__cxx11::string::~string((string *)&local_1940);
  std::allocator<char>::~allocator((allocator<char> *)&local_1941);
  StatementAttributes::~StatementAttributes(&local_1870);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1888);
  StatementAttributes::~StatementAttributes(&local_1758);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1770);
  std::allocator<chatra::StatementPatternElement>::~allocator(&local_1843);
  local_20b8 = (StatementPatternElement *)&local_1780;
  do {
    local_20b8 = local_20b8 + -1;
    StatementPatternElement::~StatementPatternElement(local_20b8);
  } while (local_20b8 != &local_17f0);
  std::__cxx11::string::~string((string *)&local_1840);
  std::allocator<char>::~allocator((allocator<char> *)&local_1841);
  std::__cxx11::string::~string((string *)&local_1818);
  std::allocator<char>::~allocator((allocator<char> *)&local_1819);
  StatementAttributes::~StatementAttributes(&local_1708);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1728);
  StatementAttributes::~StatementAttributes(&local_16b8);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_16d8);
  StatementAttributes::~StatementAttributes(&local_1600);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1618);
  std::allocator<chatra::StatementPatternElement>::~allocator(&local_168b);
  local_20d0 = (StatementPatternElement *)&local_1628;
  do {
    local_20d0 = local_20d0 + -1;
    StatementPatternElement::~StatementPatternElement(local_20d0);
  } while (local_20d0 != &local_1660);
  std::__cxx11::string::~string((string *)&local_1688);
  std::allocator<char>::~allocator((allocator<char> *)&local_1689);
  StatementAttributes::~StatementAttributes(&local_1548);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1560);
  std::allocator<chatra::StatementPatternElement>::~allocator(&local_15d3);
  local_20e8 = (StatementPatternElement *)&local_1570;
  do {
    local_20e8 = local_20e8 + -1;
    StatementPatternElement::~StatementPatternElement(local_20e8);
  } while (local_20e8 != &local_15a8);
  std::__cxx11::string::~string((string *)&local_15d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_15d1);
  StatementAttributes::~StatementAttributes(&local_13d0);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_13e8);
  std::allocator<chatra::StatementPatternElement>::~allocator(&local_151b);
  local_2100 = (StatementPatternElement *)&local_13f8;
  do {
    local_2100 = local_2100 + -1;
    StatementPatternElement::~StatementPatternElement(local_2100);
  } while (local_2100 != &local_14a0);
  std::__cxx11::string::~string((string *)&local_1518);
  std::allocator<char>::~allocator((allocator<char> *)&local_1519);
  std::__cxx11::string::~string((string *)&local_14f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_14f1);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_14c9);
  StatementAttributes::~StatementAttributes(&local_1138);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1150);
  std::allocator<chatra::StatementPatternElement>::~allocator(&local_13a3);
  local_2118 = (StatementPatternElement *)&local_1160;
  do {
    local_2118 = local_2118 + -1;
    StatementPatternElement::~StatementPatternElement(local_2118);
  } while (local_2118 != &local_12b0);
  std::__cxx11::string::~string((string *)&local_13a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_13a1);
  std::__cxx11::string::~string((string *)&local_1378);
  std::allocator<char>::~allocator((allocator<char> *)&local_1379);
  std::__cxx11::string::~string((string *)&local_1350);
  std::allocator<char>::~allocator((allocator<char> *)&local_1351);
  std::__cxx11::string::~string((string *)&local_1328);
  std::allocator<char>::~allocator((allocator<char> *)&local_1329);
  std::__cxx11::string::~string((string *)&local_1300);
  std::allocator<char>::~allocator((allocator<char> *)&local_1301);
  std::__cxx11::string::~string((string *)&local_12d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_12d9);
  StatementAttributes::~StatementAttributes(&local_10e8);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1108);
  StatementAttributes::~StatementAttributes(&local_1030);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_1048);
  std::allocator<chatra::StatementPatternElement>::~allocator(&local_10bb);
  local_2130 = (StatementPatternElement *)&local_1058;
  do {
    local_2130 = local_2130 + -1;
    StatementPatternElement::~StatementPatternElement(local_2130);
  } while (local_2130 != &local_1090);
  std::__cxx11::string::~string((string *)&local_10b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10b9);
  StatementAttributes::~StatementAttributes(&local_f78);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_f90);
  std::allocator<chatra::StatementPatternElement>::~allocator(&local_1003);
  local_2148 = (StatementPatternElement *)&local_fa0;
  do {
    local_2148 = local_2148 + -1;
    StatementPatternElement::~StatementPatternElement(local_2148);
  } while (local_2148 != &local_fd8);
  std::__cxx11::string::~string((string *)&local_1000);
  std::allocator<char>::~allocator((allocator<char> *)&local_1001);
  StatementAttributes::~StatementAttributes(&local_f28);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_f48);
  StatementAttributes::~StatementAttributes(&local_db0);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_dc8);
  std::allocator<chatra::StatementPatternElement>::~allocator(&local_efb);
  local_2160 = (StatementPatternElement *)&local_dd8;
  do {
    local_2160 = local_2160 + -1;
    StatementPatternElement::~StatementPatternElement(local_2160);
  } while (local_2160 != &local_e80);
  std::__cxx11::string::~string((string *)&local_ef8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ef9);
  std::__cxx11::string::~string((string *)&local_ed0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ed1);
  std::__cxx11::string::~string((string *)&local_ea8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ea9);
  StatementAttributes::~StatementAttributes(&local_cf8);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_d10);
  std::allocator<chatra::StatementPatternElement>::~allocator(&local_d83);
  local_2178 = (StatementPatternElement *)&local_d20;
  do {
    local_2178 = local_2178 + -1;
    StatementPatternElement::~StatementPatternElement(local_2178);
  } while (local_2178 != &local_d58);
  std::__cxx11::string::~string((string *)&local_d80);
  std::allocator<char>::~allocator((allocator<char> *)&local_d81);
  StatementAttributes::~StatementAttributes(&local_cb0);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_cc8);
  StatementAttributes::~StatementAttributes(&local_bf8);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_c10);
  std::allocator<chatra::StatementPatternElement>::~allocator(&local_c83);
  local_2190 = (StatementPatternElement *)&local_c20;
  do {
    local_2190 = local_2190 + -1;
    StatementPatternElement::~StatementPatternElement(local_2190);
  } while (local_2190 != &local_c58);
  std::__cxx11::string::~string((string *)&local_c80);
  std::allocator<char>::~allocator((allocator<char> *)&local_c81);
  StatementAttributes::~StatementAttributes(&local_a20);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_a38);
  std::allocator<chatra::StatementPatternElement>::~allocator(&local_bcb);
  local_21a8 = (StatementPatternElement *)&local_a48;
  do {
    local_21a8 = local_21a8 + -1;
    StatementPatternElement::~StatementPatternElement(local_21a8);
  } while (local_21a8 != &local_b28);
  std::__cxx11::string::~string((string *)&local_bc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bc9);
  std::__cxx11::string::~string((string *)&local_ba0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ba1);
  std::__cxx11::string::~string((string *)&local_b78);
  std::allocator<char>::~allocator((allocator<char> *)&local_b79);
  std::__cxx11::string::~string((string *)&local_b50);
  std::allocator<char>::~allocator((allocator<char> *)&local_b51);
  StatementAttributes::~StatementAttributes(&local_968);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_980);
  std::allocator<chatra::StatementPatternElement>::~allocator(&local_9f3);
  local_21c0 = (StatementPatternElement *)&local_990;
  do {
    local_21c0 = local_21c0 + -1;
    StatementPatternElement::~StatementPatternElement(local_21c0);
  } while (local_21c0 != &local_9c8);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
  StatementAttributes::~StatementAttributes(&local_610);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_628);
  std::allocator<chatra::StatementPatternElement>::~allocator(&local_93b);
  local_21d8 = (StatementPatternElement *)&local_638;
  do {
    local_21d8 = local_21d8 + -1;
    StatementPatternElement::~StatementPatternElement(local_21d8);
  } while (local_21d8 != &local_7f8);
  std::__cxx11::string::~string((string *)&local_938);
  std::allocator<char>::~allocator((allocator<char> *)&local_939);
  std::__cxx11::string::~string((string *)&local_910);
  std::allocator<char>::~allocator((allocator<char> *)&local_911);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8c1);
  std::__cxx11::string::~string((string *)&local_898);
  std::allocator<char>::~allocator((allocator<char> *)&local_899);
  std::__cxx11::string::~string((string *)&local_870);
  std::allocator<char>::~allocator((allocator<char> *)&local_871);
  std::__cxx11::string::~string((string *)&local_848);
  std::allocator<char>::~allocator((allocator<char> *)&local_849);
  std::__cxx11::string::~string((string *)&local_820);
  std::allocator<char>::~allocator((allocator<char> *)&local_821);
  StatementAttributes::~StatementAttributes(&local_4e8);
  std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
  ~vector(&local_500);
  std::allocator<chatra::StatementPatternElement>::~allocator(&local_5e3);
  local_21f0 = (StatementPatternElement *)&local_510;
  do {
    local_21f0 = local_21f0 + -1;
    StatementPatternElement::~StatementPatternElement(local_21f0);
  } while (local_21f0 != &local_580);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  __range1 = (vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
              *)0x0;
  __end1 = std::
           vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
           ::begin((vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
                    *)local_20);
  p = (pair<chatra::NodeType,_chatra::StatementAttributes> *)
      std::
      vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
      ::end((vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
             *)local_20);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::pair<chatra::NodeType,_chatra::StatementAttributes>_*,_std::vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>_>
                                *)&p);
    if (!bVar1) break;
    local_1b98 = __gnu_cxx::
                 __normal_iterator<const_std::pair<chatra::NodeType,_chatra::StatementAttributes>_*,_std::vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>_>
                 ::operator*(&__end1);
    __range1_1 = (vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
                  *)(ulong)local_1b98->first;
    puVar2 = std::max<unsigned_long>((unsigned_long *)&__range1,(unsigned_long *)&__range1_1);
    __range1 = (vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
                *)*puVar2;
    __gnu_cxx::
    __normal_iterator<const_std::pair<chatra::NodeType,_chatra::StatementAttributes>_*,_std::vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<chatra::StatementAttributes,_std::allocator<chatra::StatementAttributes>_>::resize
            ((vector<chatra::StatementAttributes,_std::allocator<chatra::StatementAttributes>_> *)
             stAttrs,(size_type)
                     ((long)&(__range1->
                             super__Vector_base<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1));
  __end1_1 = std::
             vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
             ::begin((vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
                      *)local_20);
  p_1 = (pair<chatra::NodeType,_chatra::StatementAttributes> *)
        std::
        vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
        ::end((vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
               *)local_20);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_std::pair<chatra::NodeType,_chatra::StatementAttributes>_*,_std::vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>_>
                        *)&p_1);
    if (!bVar1) break;
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<chatra::NodeType,_chatra::StatementAttributes>_*,_std::vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>_>
             ::operator*(&__end1_1);
    this = std::vector<chatra::StatementAttributes,_std::allocator<chatra::StatementAttributes>_>::
           operator[]((vector<chatra::StatementAttributes,_std::allocator<chatra::StatementAttributes>_>
                       *)stAttrs,(ulong)ppVar3->first);
    StatementAttributes::operator=(this,&ppVar3->second);
    __gnu_cxx::
    __normal_iterator<const_std::pair<chatra::NodeType,_chatra::StatementAttributes>_*,_std::vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
  ::~vector((vector<std::pair<chatra::NodeType,_chatra::StatementAttributes>,_std::allocator<std::pair<chatra::NodeType,_chatra::StatementAttributes>_>_>
             *)local_20);
  return;
}

Assistant:

static void initializeStTables() {
	const std::vector<std::pair<NodeType, StatementAttributes>> sourceForStAttrs = {
			{NodeType::Import, {SubNode::Import_SubNodes, 1, {
					{StPt::LabelWithColon, StringId::Invalid, false, SubNode::Import_Alias},
					{StPt::Name, StringId::Invalid, true, SubNode::Import_Package, "expected package name"}
			}}},
			{NodeType::Def, {SubNode::Def_SubNodes, 1, {
					{StPt::StorageClassSpecifier, StringId::Invalid, false, SubNode::Def_Static},
					{StPt::Name, StringId::Invalid, false, SubNode::Def_Name},
					{StPt::VariationName, StringId::Invalid, false, SubNode::Def_Variation},
					{StPt::ParameterList, StringId::Invalid, true, SubNode::Def_Parameter, "expected parameter list"},
					{StPt::VariationName, StringId::Invalid, false, SubNode::Def_Operator},
					{StPt::ParameterList, StringId::Invalid, false, SubNode::Def_OperatorParameter},
					{StPt::Token, StringId::Delete, false, SubNode::Def_Delete},
					{StPt::Qualifiers, StringId::Invalid, false, SubNode::Def_Qualifiers}
			}}},
			{NodeType::DefOperator, {1, 2, {
					{StPt::OperatorParameter, StringId::Invalid, true, 0, "expected operator parameter set"}
			}}},
			{NodeType::Class, {SubNode::Class_SubNodes, 1, {
					{StPt::StorageClassSpecifier, StringId::Invalid, false, SubNode::Class_Static},
					{StPt::Name, StringId::Invalid, true, SubNode::Class_Name, "expected class name"},
					{StPt::Token, StringId::Extends, false, SubNode::Class_Extends},
					{StPt::ClassList, StringId::Invalid, false, SubNode::Class_BaseClassList}
			}}},
			{NodeType::Expression, {1, 0, {
					{StPt::Expression, StringId::Invalid, true, 0, "expected expression"}
			}}},
			{NodeType::Sync, {0, 1, {}}},
			{NodeType::Touch, {1, 1, {
					{StPt::Expression, StringId::Invalid, true, 0, "expected expression"}
			}}},
			{NodeType::Var, {SubNode::Var_SubNodes, 1, {
					{StPt::StorageClassSpecifier, StringId::Invalid, false, SubNode::Var_Static},
					{StPt::VarDefinitions, StringId::Invalid, true, SubNode::Var_Definitions, "expected variable definitions"},
					{StPt::Qualifiers, StringId::Invalid, false, SubNode::Var_Qualifiers}
			}}},
			{NodeType::IfGroup, {0, 0, {}}},
			{NodeType::If, {1, 1, {
					{StPt::Expression, StringId::Invalid, true, 0, "expected expression"}
			}}},
			{NodeType::ElseIf, {1, 2, {
					{StPt::Expression, StringId::Invalid, true, 0, "expected expression"}
			}}},
			{NodeType::Else, {0, 1, {}}},
			{NodeType::For, {SubNode::For_SubNodes, 0, {
					{StPt::LabelWithColon, StringId::Invalid, false, SubNode::For_Label},
					{StPt::Token, StringId::For, true, SIZE_MAX  /* internal error */},
					{StPt::LabelWithColon, StringId::Invalid, false, SubNode::For_Iterator},
					{StPt::ForLoopVariables, StringId::Invalid, false, SubNode::For_LoopVariable},
					{StPt::Token, StringId::In, true, SIZE_MAX, "expected \"in\""},
					{StPt::Expression, StringId::Invalid, true, SubNode::For_Iterable, "expected expression"}
			}}},
			{NodeType::While, {SubNode::While_SubNodes, 0, {
					{StPt::LabelWithColon, StringId::Invalid, false, SubNode::While_Label},
					{StPt::Token, StringId::While, true, SIZE_MAX  /* internal error */},
					{StPt::Expression, StringId::Invalid, true, SubNode::While_Condition, "expected expression"}
			}}},
			{NodeType::Switch, {1, 1, {
					{StPt::Expression, StringId::Invalid, true, 0, "expected expression"}
			}}},
			{NodeType::Case, {1, 1, {
					{StPt::Expression, StringId::Invalid, true, 0, "expected expression"}
			}}},
			{NodeType::Default, {0, 1, {}}},
			{NodeType::Do, {0, 1, {}}},
			{NodeType::Catch, {SubNode::Catch_SubNodes, 1, {
					{StPt::LabelWithColon, StringId::Invalid, false, SubNode::Catch_Label},
					{StPt::ClassList, StringId::Invalid, true, SubNode::Catch_ClassList, "expected exception-class list"}
			}}},
			{NodeType::Finally, {0, 1, {}}},
			{NodeType::Break, {1, 1, {
					{StPt::Label, StringId::Invalid, false, 0}
			}}},
			{NodeType::Continue, {1, 1, {
					{StPt::Label, StringId::Invalid, false, 0}
			}}},
			{NodeType::Return, {1, 1, {
					{StPt::TupleExpression, StringId::Invalid, false, 0}
			}}},
			{NodeType::Throw, {1, 1, {
					{StPt::Expression, StringId::Invalid, false, 0}
			}}}
	};

	size_t maxIndex = 0;
	for (auto& p : sourceForStAttrs)
		maxIndex = std::max(maxIndex, static_cast<size_t>(p.first));
	stAttrs.resize(maxIndex + 1);
	for (auto& p : sourceForStAttrs)
		stAttrs[static_cast<size_t>(p.first)] = p.second;
}